

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosine_window.cc
# Opt level: O1

void __thiscall
sptk::CosineWindow::CosineWindow
          (CosineWindow *this,int window_length,vector<double,_std::allocator<double>_> *alpha,
          bool periodic)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  pointer pdVar4;
  double dVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  (this->super_WindowInterface)._vptr_WindowInterface = (_func_int **)&PTR__CosineWindow_00111d08;
  this->window_length_ = window_length;
  this->periodic_ = periodic;
  this->is_valid_ = true;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((window_length < 1) ||
     ((alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    this->is_valid_ = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(&this->window_,(ulong)(uint)window_length);
    iVar3 = this->window_length_;
    if (iVar3 == 1) {
      *(this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
    }
    else if (0 < this->window_length_) {
      bVar2 = this->periodic_;
      pdVar4 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (uint)((ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(alpha->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar6 = 0;
      do {
        dVar11 = *(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (1 < (int)uVar8) {
          iVar7 = -1;
          uVar10 = 1;
          uVar9 = uVar6 & 0xffffffff;
          do {
            dVar1 = (alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
            dVar5 = cos((double)(int)uVar9 *
                        (6.283185307179586 / (double)(int)(iVar3 - (bVar2 ^ 1))));
            dVar11 = dVar11 + dVar5 * (double)iVar7 * dVar1;
            iVar7 = -iVar7;
            uVar10 = uVar10 + 1;
            uVar9 = (ulong)(uint)((int)uVar9 + (int)uVar6);
          } while ((uVar8 & 0x7fffffff) != uVar10);
        }
        pdVar4[uVar6] = dVar11;
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)this->window_length_);
    }
  }
  return;
}

Assistant:

CosineWindow::CosineWindow(int window_length, const std::vector<double>& alpha,
                           bool periodic)
    : window_length_(window_length), periodic_(periodic), is_valid_(true) {
  if (window_length_ <= 0 || alpha.empty()) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length_);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const int alpha_size(static_cast<int>(alpha.size()));
  const double m(kTwoPi / (periodic_ ? window_length_ : window_length_ - 1));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    double sum(alpha[0]);
    int sign(-1);
    for (int k(1); k < alpha_size; ++k) {
      sum += sign * alpha[k] * std::cos(i * k * m);
      sign *= -1;
    }
    window[i] = sum;
  }
}